

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.h
# Opt level: O0

void * tommy_list_remove_existing(tommy_list *list,tommy_node *node)

{
  long lVar1;
  tommy_node *ptVar2;
  long in_FS_OFFSET;
  tommy_node *head;
  tommy_node *node_local;
  tommy_list *list_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = tommy_list_head(list);
  if (node->next == (tommy_node_struct *)0x0) {
    ptVar2->prev = node->prev;
  }
  else {
    node->next->prev = node->prev;
  }
  if (ptVar2 == node) {
    *list = node->next;
  }
  else {
    node->prev->next = node->next;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void* tommy_list_remove_existing(tommy_list* list, tommy_node* node)
{
	tommy_node* head = tommy_list_head(list);

	/* remove from the "circular" prev list */
	if (node->next)
		node->next->prev = node->prev;
	else
		head->prev = node->prev; /* the last */

	/* remove from the "0 terminated" next list */
	if (head == node)
		*list = node->next; /* the new head, in case 0 */
	else
		node->prev->next = node->next;

	return node->data;
}